

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# array.h
# Opt level: O2

_Bool array_container_add(array_container_t *arr,uint16_t value)

{
  int lenarray;
  undefined1 extraout_AL;
  uint uVar1;
  uint16_t *puVar2;
  
  lenarray = arr->cardinality;
  if (((long)lenarray != 0) &&
     ((lenarray == 0x7fffffff || (value <= arr->array[(long)lenarray + -1])))) {
    uVar1 = binarySearch(arr->array,lenarray,value);
    puVar2 = (uint16_t *)(ulong)(-1 < (int)uVar1 || lenarray == 0x7fffffff);
    if (-1 >= (int)uVar1 && lenarray != 0x7fffffff) {
      if (arr->cardinality == arr->capacity) {
        array_container_grow(arr,arr->cardinality + 1,true);
      }
      uVar1 = ~uVar1;
      memmove(arr->array + (ulong)uVar1 + 1,arr->array + uVar1,(long)(int)(lenarray - uVar1) * 2);
      puVar2 = arr->array;
      puVar2[uVar1] = value;
      arr->cardinality = arr->cardinality + 1;
    }
    return SUB81(puVar2,0);
  }
  array_container_append(arr,value);
  return (_Bool)extraout_AL;
}

Assistant:

static inline bool array_container_add(array_container_t *arr, uint16_t value) {
    return array_container_try_add(arr, value, INT32_MAX) == 1;
}